

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

htmlParserCtxtPtr htmlCreateFileParserCtxt(char *filename,char *encoding)

{
  xmlMallocFunc p_Var1;
  int iVar2;
  htmlParserCtxtPtr ctxt;
  xmlChar *pxVar3;
  xmlParserInputPtr value;
  size_t sVar4;
  
  if (filename != (char *)0x0) {
    ctxt = htmlNewSAXParserCtxt((htmlSAXHandler *)0x0,(void *)0x0);
    if (ctxt == (htmlParserCtxtPtr)0x0) {
      return (htmlParserCtxtPtr)0x0;
    }
    pxVar3 = xmlCanonicPath((xmlChar *)filename);
    if (pxVar3 != (xmlChar *)0x0) {
      value = xmlLoadExternalEntity((char *)pxVar3,(char *)0x0,ctxt);
      (*xmlFree)(pxVar3);
      if (value != (xmlParserInputPtr)0x0) {
        inputPush(ctxt,value);
        if (encoding == (char *)0x0) {
          return ctxt;
        }
        sVar4 = strlen(encoding);
        p_Var1 = xmlMallocAtomic;
        if (999 < sVar4) {
          return ctxt;
        }
        iVar2 = xmlStrlen("charset=");
        pxVar3 = (xmlChar *)(*p_Var1)(sVar4 + (long)iVar2 + 1);
        if (pxVar3 == (xmlChar *)0x0) {
          return ctxt;
        }
        builtin_memcpy(pxVar3,"charset=",9);
        strcat((char *)pxVar3,encoding);
        htmlCheckEncoding(ctxt,pxVar3);
        (*xmlFree)(pxVar3);
        return ctxt;
      }
    }
    xmlFreeParserCtxt(ctxt);
  }
  return (htmlParserCtxtPtr)0x0;
}

Assistant:

htmlParserCtxtPtr
htmlCreateFileParserCtxt(const char *filename, const char *encoding)
{
    htmlParserCtxtPtr ctxt;
    htmlParserInputPtr inputStream;
    char *canonicFilename;
    /* htmlCharEncoding enc; */
    xmlChar *content, *content_line = (xmlChar *) "charset=";

    if (filename == NULL)
        return(NULL);

    ctxt = htmlNewParserCtxt();
    if (ctxt == NULL) {
	return(NULL);
    }
    canonicFilename = (char *) xmlCanonicPath((const xmlChar *) filename);
    if (canonicFilename == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    inputStream = xmlLoadExternalEntity(canonicFilename, NULL, ctxt);
    xmlFree(canonicFilename);
    if (inputStream == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    inputPush(ctxt, inputStream);

    /* set encoding */
    if (encoding) {
        size_t l = strlen(encoding);

	if (l < 1000) {
	    content = xmlMallocAtomic (xmlStrlen(content_line) + l + 1);
	    if (content) {
		strcpy ((char *)content, (char *)content_line);
		strcat ((char *)content, (char *)encoding);
		htmlCheckEncoding (ctxt, content);
		xmlFree (content);
	    }
	}
    }

    return(ctxt);
}